

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,FixedArray<char,_1UL> *params,
          FixedArray<char,_1UL> *params_1,FixedArray<char,_1UL> *params_2)

{
  size_t sVar1;
  Branch *pBVar2;
  String local_48;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  __return_storage_ptr__->size_ = 3;
  heapString(&local_48,3);
  (__return_storage_ptr__->text).content.ptr = local_48.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_48.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_48.content.disposer;
  pBVar2 = (Branch *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::
                               construct,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  sVar1 = this->size_;
  (__return_storage_ptr__->branches).ptr = pBVar2;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  if (local_48.content.size_ == 0) {
    local_48.content.ptr = (char *)0x0;
  }
  *local_48.content.ptr = (char)sVar1;
  local_48.content.ptr[1] = params->content[0];
  local_48.content.ptr[2] = params_1->content[0];
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}